

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_msg.c
# Opt level: O3

void send_failure_info(char *msg)

{
  FILE *fdes;
  FailMsg fmsg;
  undefined8 local_10;
  
  local_10 = strdup(msg);
  fdes = send_file2;
  if ((send_file2 == (FILE *)0x0) && (fdes = send_file1, send_file1 == (FILE *)0x0)) {
    eprintf("Unable to report test progress or a failure; was an ck_assert or ck_abort function called while not running tests?"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_msg.c"
            ,0x50);
  }
  ppack(fdes,CK_MSG_FAIL,(CheckMsg *)&stack0xfffffffffffffff0);
  free((void *)local_10);
  return;
}

Assistant:

void send_failure_info(const char *msg)
{
    FailMsg fmsg;

    fmsg.msg = strdup(msg);
    ppack(get_pipe(), CK_MSG_FAIL, (CheckMsg *) & fmsg);
    free(fmsg.msg);
}